

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Counter.cxx
# Opt level: O3

void __thiscall Fl_Counter::increment_cb(Fl_Counter *this)

{
  int n;
  double dVar1;
  
  if (this->mouseobj == '\0') {
    return;
  }
  dVar1 = (this->super_Fl_Valuator).value_;
  switch(this->mouseobj) {
  case '\x01':
    dVar1 = dVar1 - this->lstep_;
    break;
  case '\x02':
    n = -1;
    goto LAB_001ab278;
  case '\x03':
    n = 1;
LAB_001ab278:
    dVar1 = Fl_Valuator::increment(&this->super_Fl_Valuator,dVar1,n);
    break;
  case '\x04':
    dVar1 = dVar1 + this->lstep_;
  }
  dVar1 = Fl_Valuator::round(&this->super_Fl_Valuator,dVar1);
  dVar1 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar1);
  Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar1);
  return;
}

Assistant:

void Fl_Counter::increment_cb() {
  if (!mouseobj) return;
  double v = value();
  switch (mouseobj) {
  case 1: v -= lstep_; break;
  case 2: v = increment(v, -1); break;
  case 3: v = increment(v, 1); break;
  case 4: v += lstep_; break;
  }
  handle_drag(clamp(round(v)));
}